

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void QApplication::alert(QWidget *widget,int duration)

{
  QWidget **ppQVar1;
  bool bVar2;
  WindowStates WVar3;
  QWidget *pQVar4;
  QWindow *pQVar5;
  QWidgetList *__range2;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    topLevelWidgets();
    ppQVar1 = local_48.ptr;
    lVar7 = local_48.size << 3;
    for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 8) {
      alert(*(QWidget **)((long)ppQVar1 + lVar6),duration);
    }
    QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_48);
  }
  else {
    pQVar4 = QWidget::window(widget);
    bVar2 = QWidget::isActiveWindow(pQVar4);
    if (bVar2) {
      pQVar4 = QWidget::window(widget);
      WVar3 = QWidget::windowState(pQVar4);
      if (((uint)WVar3.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i & 1) == 0) goto LAB_002c1115;
    }
    pQVar5 = QApplicationPrivate::windowForWidget(widget);
    if (pQVar5 != (QWindow *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QWindow::alert((int)pQVar5);
        return;
      }
      goto LAB_002c1131;
    }
  }
LAB_002c1115:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_002c1131:
  __stack_chk_fail();
}

Assistant:

void QApplication::alert(QWidget *widget, int duration)
{
    if (widget) {
       if (widget->window()->isActiveWindow() && !(widget->window()->windowState() & Qt::WindowMinimized))
            return;
        if (QWindow *window= QApplicationPrivate::windowForWidget(widget))
            window->alert(duration);
    } else {
        const auto topLevels = topLevelWidgets();
        for (QWidget *topLevel : topLevels)
            QApplication::alert(topLevel, duration);
    }
}